

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

InstMeshInfo *
rw::ps2::getInstMeshInfo(InstMeshInfo *__return_storage_ptr__,MatPipeline *pipe,Geometry *g,Mesh *m)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  int iVar8;
  uint i;
  uint32 uVar9;
  long lVar10;
  
  uVar9 = 0;
  uVar7 = 0;
  uVar5 = 0;
  for (lVar10 = 4; lVar10 != 0xe; lVar10 = lVar10 + 1) {
    if (pipe->attribs[lVar10 + -4] != (PipeAttribute *)0x0) {
      uVar1 = pipe->attribs[lVar10 + -4]->attrib;
      if ((uVar1 & 6) == 0) {
        uVar2 = attribSize(uVar1);
        uVar7 = uVar7 + uVar2;
        uVar9 = uVar9 + 1;
      }
      else {
        uVar5 = uVar5 + 1;
      }
    }
  }
  __return_storage_ptr__->numBrokenAttribs = uVar5;
  __return_storage_ptr__->vertexSize = uVar7;
  __return_storage_ptr__->numAttribs = uVar9;
  uVar1 = m->numIndices;
  if (g->meshHeader->flags == 1) {
    uVar6 = pipe->triStripCount;
    uVar3 = (uVar1 - 2) / (uVar6 - 2);
    uVar4 = (uVar1 - 2) % (uVar6 - 2);
    __return_storage_ptr__->numBatches = uVar3;
    __return_storage_ptr__->batchVertCount = uVar6;
    if (uVar4 != 0) {
      uVar3 = uVar3 + 1;
      __return_storage_ptr__->numBatches = uVar3;
      uVar4 = uVar4 + 2;
      goto LAB_0012152d;
    }
  }
  else {
    uVar6 = pipe->triListCount;
    uVar3 = ((uVar1 + uVar6) - 1) / uVar6;
    __return_storage_ptr__->numBatches = uVar3;
    __return_storage_ptr__->batchVertCount = uVar6;
    uVar4 = uVar1 % uVar6;
LAB_0012152d:
    __return_storage_ptr__->lastBatchVertCount = uVar4;
    if (uVar4 != 0) goto LAB_00121539;
  }
  __return_storage_ptr__->lastBatchVertCount = uVar6;
  uVar4 = uVar6;
LAB_00121539:
  uVar7 = getBatchSize(pipe,uVar6);
  __return_storage_ptr__->batchSize = uVar7;
  uVar9 = getBatchSize(pipe,uVar4);
  __return_storage_ptr__->lastBatchSize = uVar9;
  if (uVar5 == 0) {
    iVar8 = (uVar3 - 1) * uVar7 + uVar9;
  }
  else {
    iVar8 = (uVar3 - 1) * (uVar7 + 1) + uVar9 + uVar5 * uVar3 * 2;
  }
  __return_storage_ptr__->size = iVar8 + 1U;
  uVar5 = 0;
  for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
    if ((pipe->attribs[lVar10] != (PipeAttribute *)0x0) &&
       (uVar6 = pipe->attribs[lVar10]->attrib, (uVar6 & 6) != 0)) {
      __return_storage_ptr__->attribPos[lVar10] = iVar8 + 1U + uVar5;
      uVar7 = attribSize(uVar6);
      uVar5 = (uVar7 * uVar1 + 0xf >> 4) + uVar5;
    }
  }
  __return_storage_ptr__->size2 = uVar5;
  return __return_storage_ptr__;
}

Assistant:

InstMeshInfo
getInstMeshInfo(MatPipeline *pipe, Geometry *g, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im;
	im.numAttribs = 0;
	im.numBrokenAttribs = 0;
	im.vertexSize = 0;
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])) {
			if(a->attrib & AT_RW)
				im.numBrokenAttribs++;
			else{
				im.vertexSize += attribSize(a->attrib);
				im.numAttribs++;
			}
		}
	if(g->meshHeader->flags == MeshHeader::TRISTRIP){
		im.numBatches = (m->numIndices-2) / (pipe->triStripCount-2);
		im.batchVertCount = pipe->triStripCount;
		im.lastBatchVertCount = (m->numIndices-2) % (pipe->triStripCount-2);
		if(im.lastBatchVertCount){
			im.numBatches++;
			im.lastBatchVertCount += 2;
		}
	}else{	// TRILIST; nothing else supported yet
		im.numBatches = (m->numIndices+pipe->triListCount-1) /
		                 pipe->triListCount;
		im.batchVertCount = pipe->triListCount;
		im.lastBatchVertCount = m->numIndices % pipe->triListCount;
	}
	if(im.lastBatchVertCount == 0)
		im.lastBatchVertCount = im.batchVertCount;

	im.batchSize = getBatchSize(pipe, im.batchVertCount);
	im.lastBatchSize = getBatchSize(pipe, im.lastBatchVertCount);
	if(im.numBrokenAttribs == 0)
		im.size = 1 + im.batchSize*(im.numBatches-1) + im.lastBatchSize;
	else
		im.size = 2*im.numBrokenAttribs*im.numBatches +
		          (1+im.batchSize)*(im.numBatches-1) + 1+im.lastBatchSize;

	/* figure out size and addresses of broken out sections */
	im.size2 = 0;
	for(uint i = 0; i < nelem(im.attribPos); i++)
		if((a = pipe->attribs[i]) && a->attrib & AT_RW){
			im.attribPos[i] = im.size2 + im.size;
			im.size2 += QWC(m->numIndices*attribSize(a->attrib));
		}

	return im;
}